

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_http_cb_dialer(nni_ws *ws,nni_aio *aio)

{
  nni_ws_dialer *pnVar1;
  nni_aio *aio_00;
  _Bool _Var2;
  nng_http_status nVar3;
  int iVar4;
  char *pcVar5;
  char *ptr;
  char wskey [29];
  nng_err local_2c;
  uint16_t status;
  int rv;
  nni_aio *uaio;
  nni_ws_dialer *d;
  nni_aio *aio_local;
  nni_ws *ws_local;
  
  pnVar1 = ws->dialer;
  nni_mtx_lock(&pnVar1->mtx);
  aio_00 = ws->useraio;
  local_2c = nni_aio_result(aio);
  if ((local_2c == NNG_OK) && (aio_00 != (nni_aio *)0x0)) {
    if ((pnVar1->closed & 1U) == 0) {
      if ((ws->recv_res & 1U) == 0) {
        ws->recv_res = true;
        nng_http_read_response(ws->http,&ws->httpaio);
        nni_mtx_unlock(&pnVar1->mtx);
        return;
      }
      nVar3 = nni_http_get_status(ws->http);
      nVar3 = nVar3 & 0xffff;
      if (nVar3 == NNG_HTTP_STATUS_SWITCHING) {
        local_2c = ws_make_accept(ws->keybuf,(char *)&ptr);
        if (local_2c == NNG_OK) {
          pcVar5 = nng_http_get_header(ws->http,"Sec-WebSocket-Accept");
          if (((((pcVar5 == (char *)0x0) || (iVar4 = strcmp(pcVar5,(char *)&ptr), iVar4 != 0)) ||
               (pcVar5 = nng_http_get_header(ws->http,"Connection"), pcVar5 == (char *)0x0)) ||
              ((_Var2 = ws_contains_word(pcVar5,"upgrade"), !_Var2 ||
               (pcVar5 = nng_http_get_header(ws->http,"Upgrade"), pcVar5 == (char *)0x0)))) ||
             (iVar4 = strcmp(pcVar5,"websocket"), iVar4 != 0)) {
            ws_close_error(ws,0x3ea);
            local_2c = NNG_EPROTO;
          }
          else {
            if ((pnVar1->proto == (char *)0x0) ||
               ((pcVar5 = nng_http_get_header(ws->http,"Sec-WebSocket-Protocol"),
                pcVar5 != (char *)0x0 && (_Var2 = ws_contains_word(pnVar1->proto,pcVar5), _Var2))))
            {
              nni_list_remove(&pnVar1->wspend,ws);
              ws->ready = true;
              ws->useraio = (nni_aio *)0x0;
              ws->dialer = (nni_ws_dialer *)0x0;
              nni_aio_set_output(aio_00,0,ws);
              nni_aio_finish(aio_00,NNG_OK,0);
              iVar4 = nni_list_empty(&pnVar1->wspend);
              if (iVar4 != 0) {
                nni_cv_wake(&pnVar1->cv);
              }
              nni_mtx_unlock(&pnVar1->mtx);
              return;
            }
            ws_close_error(ws,0x3ea);
            local_2c = NNG_EPROTO;
          }
        }
      }
      else {
        if (nVar3 != NNG_HTTP_STATUS_BAD_REQUEST) {
          if ((nVar3 == NNG_HTTP_STATUS_UNAUTHORIZED) || (nVar3 == NNG_HTTP_STATUS_FORBIDDEN)) {
            local_2c = NNG_EPERM;
            goto LAB_00143de7;
          }
          if ((nVar3 - NNG_HTTP_STATUS_NOT_FOUND < 2) || (nVar3 == NNG_HTTP_STATUS_NOT_IMPLEMENTED))
          {
            local_2c = NNG_ECONNREFUSED;
            goto LAB_00143de7;
          }
        }
        local_2c = NNG_EPROTO;
      }
    }
    else {
      local_2c = NNG_ECLOSED;
    }
  }
LAB_00143de7:
  nni_list_remove(&pnVar1->wspend,ws);
  ws->useraio = (nni_aio *)0x0;
  ws->dialer = (nni_ws_dialer *)0x0;
  iVar4 = nni_list_empty(&pnVar1->wspend);
  if (iVar4 != 0) {
    nni_cv_wake(&pnVar1->cv);
  }
  if (aio_00 != (nni_aio *)0x0) {
    nni_aio_finish_error(aio_00,local_2c);
  }
  nni_mtx_unlock(&pnVar1->mtx);
  ws_reap(ws);
  return;
}

Assistant:

static void
ws_http_cb_dialer(nni_ws *ws, nni_aio *aio)
{
	nni_ws_dialer *d;
	nni_aio       *uaio;
	int            rv;
	uint16_t       status;
	char           wskey[29];
	const char    *ptr;

	d = ws->dialer;
	nni_mtx_lock(&d->mtx);
	uaio = ws->useraio;

	// We have two steps.  In step 1, we just sent the request,
	// and need to retrieve the reply.  In step two we have
	// received the reply, and need to validate it.
	// Note that its possible that the user canceled the request,
	// in which case we no longer care, and just go to the error
	// case to discard the ws.
	if (((rv = nni_aio_result(aio)) != 0) || (uaio == NULL)) {
		goto err;
	}

	// There is a race between the dialer closing and any connections
	// that were in progress completing.
	if (d->closed) {
		rv = NNG_ECLOSED;
		goto err;
	}

	// If we have no response structure, then this was completion
	// of sending the request.  Prepare an empty response, and read it.
	if (!ws->recv_res) {
		ws->recv_res = true;
		nng_http_read_response(ws->http, &ws->httpaio);
		nni_mtx_unlock(&d->mtx);
		return;
	}

	status = nni_http_get_status(ws->http);
	switch (status) {
	case NNG_HTTP_STATUS_SWITCHING:
		break;
	case NNG_HTTP_STATUS_FORBIDDEN:
	case NNG_HTTP_STATUS_UNAUTHORIZED:
		rv = NNG_EPERM;
		goto err;
	case NNG_HTTP_STATUS_NOT_FOUND:
	case NNG_HTTP_STATUS_METHOD_NOT_ALLOWED:
	case NNG_HTTP_STATUS_NOT_IMPLEMENTED:
		rv = NNG_ECONNREFUSED; // Treat these as refusals.
		goto err;
	case NNG_HTTP_STATUS_BAD_REQUEST:
	default:
		// Perhaps we should use NNG_ETRANERR...
		rv = NNG_EPROTO;
		goto err;
	}

	rv = ws_make_accept(ws->keybuf, wskey);
	if (rv != 0) {
		goto err;
	}

	if (((ptr = nng_http_get_header(ws->http, "Sec-WebSocket-Accept")) ==
	        NULL) ||
	    (strcmp(ptr, wskey) != 0) ||
	    ((ptr = nng_http_get_header(ws->http, "Connection")) == NULL) ||
	    (!ws_contains_word(ptr, "upgrade")) ||
	    ((ptr = nng_http_get_header(ws->http, "Upgrade")) == NULL) ||
	    (strcmp(ptr, "websocket") != 0)) {
		ws_close_error(ws, WS_CLOSE_PROTOCOL_ERR);
		rv = NNG_EPROTO;
		goto err;
	}
	if (d->proto != NULL) {
		if (((ptr = nng_http_get_header(
		          ws->http, "Sec-WebSocket-Protocol")) == NULL) ||
		    (!ws_contains_word(d->proto, ptr))) {
			ws_close_error(ws, WS_CLOSE_PROTOCOL_ERR);
			rv = NNG_EPROTO;
			goto err;
		}
	}

	// At this point, we are in business!
	nni_list_remove(&d->wspend, ws);
	ws->ready   = true;
	ws->useraio = NULL;
	ws->dialer  = NULL;
	nni_aio_set_output(uaio, 0, ws);
	nni_aio_finish(uaio, 0, 0);
	if (nni_list_empty(&d->wspend)) {
		nni_cv_wake(&d->cv);
	}
	nni_mtx_unlock(&d->mtx);
	return;
err:
	nni_list_remove(&d->wspend, ws);
	ws->useraio = NULL;
	ws->dialer  = NULL;
	if (nni_list_empty(&d->wspend)) {
		nni_cv_wake(&d->cv);
	}
	if (uaio != NULL) {
		nni_aio_finish_error(uaio, rv);
	}
	nni_mtx_unlock(&d->mtx);

	ws_reap(ws);
}